

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  size_t *psVar1;
  ushort uVar2;
  uint uVar3;
  huff_entropy_ptr entropy;
  jpeg_destination_mgr *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  JOCTET *pJVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ushort uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  char *bufstart;
  int absvalues [64];
  uint auStack_138 [66];
  
  entropy = (huff_entropy_ptr)cinfo->entropy;
  pjVar4 = cinfo->dest;
  entropy->next_output_byte = pjVar4->next_output_byte;
  entropy->free_in_buffer = pjVar4->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  uVar9 = cinfo->Se;
  piVar5 = cinfo->natural_order;
  paJVar6 = *MCU_data;
  iVar13 = cinfo->Ss;
  lVar17 = (long)iVar13;
  uVar16 = 0;
  if (iVar13 <= (int)uVar9) {
    iVar15 = cinfo->Al;
    lVar10 = 0;
    do {
      uVar2 = (*paJVar6)[piVar5[lVar17 + lVar10]];
      uVar12 = -uVar2;
      if (0 < (short)uVar2) {
        uVar12 = uVar2;
      }
      uVar11 = (uint)(uVar12 >> ((byte)iVar15 & 0x1f));
      if (uVar11 == 1) {
        uVar16 = (ulong)(uint)(iVar13 + (int)lVar10);
      }
      auStack_138[lVar17 + lVar10] = uVar11;
      lVar10 = lVar10 + 1;
    } while (~uVar9 + iVar13 + (int)lVar10 != 0);
    uVar16 = (ulong)(int)uVar16;
  }
  uVar11 = 0;
  bVar8 = false;
  if (iVar13 <= (int)uVar9) {
    bufstart = entropy->bit_buffer + entropy->BE;
    iVar13 = 0;
    uVar11 = 0;
    do {
      uVar3 = auStack_138[lVar17];
      if (uVar3 == 0) {
        iVar13 = iVar13 + 1;
      }
      else {
        iVar15 = iVar13;
        if (0xf < iVar13) {
          do {
            iVar13 = iVar15;
            if ((long)uVar16 < lVar17) break;
            emit_eobrun(entropy);
            emit_ac_symbol(entropy,entropy->ac_tbl_no,0xf0);
            iVar13 = iVar15 + -0x10;
            emit_buffered_bits(entropy,bufstart,uVar11);
            bufstart = entropy->bit_buffer;
            uVar11 = 0;
            bVar8 = 0x1f < iVar15;
            iVar15 = iVar13;
          } while (bVar8);
        }
        if ((int)uVar3 < 2) {
          emit_eobrun(entropy);
          emit_ac_symbol(entropy,entropy->ac_tbl_no,iVar13 * 0x10 + 1);
          if (entropy->gather_statistics == 0) {
            iVar13 = (entropy->saved).put_bits;
            uVar14 = (ulong)(-1 < (*paJVar6)[piVar5[lVar17]]) << (0x17U - (char)iVar13 & 0x3f) |
                     (entropy->saved).put_buffer;
            if (iVar13 < 7) {
              iVar13 = iVar13 + 1;
            }
            else {
              iVar15 = iVar13 + 9;
              do {
                iVar13 = iVar15;
                pJVar7 = entropy->next_output_byte;
                entropy->next_output_byte = pJVar7 + 1;
                *pJVar7 = (JOCTET)(uVar14 >> 0x10);
                psVar1 = &entropy->free_in_buffer;
                *psVar1 = *psVar1 - 1;
                if (*psVar1 == 0) {
                  dump_buffer_e(entropy);
                }
                if ((~(uint)uVar14 & 0xff0000) == 0) {
                  pJVar7 = entropy->next_output_byte;
                  entropy->next_output_byte = pJVar7 + 1;
                  *pJVar7 = '\0';
                  psVar1 = &entropy->free_in_buffer;
                  *psVar1 = *psVar1 - 1;
                  if (*psVar1 == 0) {
                    dump_buffer_e(entropy);
                  }
                }
                uVar14 = uVar14 << 8;
                iVar15 = iVar13 + -8;
              } while (0xf < iVar15);
              iVar13 = iVar13 + -0x10;
            }
            (entropy->saved).put_buffer = uVar14;
            (entropy->saved).put_bits = iVar13;
          }
          emit_buffered_bits(entropy,bufstart,uVar11);
          bufstart = entropy->bit_buffer;
          uVar11 = 0;
          iVar13 = 0;
        }
        else {
          uVar14 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
          bufstart[uVar14] = (byte)uVar3 & 1;
        }
      }
      lVar17 = lVar17 + 1;
    } while (uVar9 + 1 != (int)lVar17);
    bVar8 = 0 < iVar13;
  }
  if ((bool)(uVar11 != 0 | bVar8)) {
    uVar9 = entropy->EOBRUN + 1;
    entropy->EOBRUN = uVar9;
    uVar11 = uVar11 + entropy->BE;
    entropy->BE = uVar11;
    if ((uVar9 == 0x7fff) || (0x3a9 < uVar11)) {
      emit_eobrun(entropy);
    }
  }
  pjVar4 = cinfo->dest;
  pjVar4->next_output_byte = entropy->next_output_byte;
  pjVar4->free_in_buffer = entropy->free_in_buffer;
  if (cinfo->restart_interval != 0) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
    }
    entropy->restarts_to_go = entropy->restarts_to_go - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp;
  register int r, k;
  int EOB;
  char *BR_buffer;
  unsigned int BR;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  int absvalues[DCTSIZE2];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  Se = cinfo->Se;
  Al = cinfo->Al;
  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];

  /* It is convenient to make a pre-pass to determine the transformed
   * coefficients' absolute values and the EOB position.
   */
  EOB = 0;
  for (k = cinfo->Ss; k <= Se; k++) {
    temp = (*block)[natural_order[k]];
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if (temp < 0)
      temp = -temp;		/* temp is abs value of input */
    temp >>= Al;		/* apply the point transform */
    absvalues[k] = temp;	/* save abs value for main pass */
    if (temp == 1)
      EOB = k;			/* EOB = index of last newly-nonzero coef */
  }

  /* Encode the AC coefficients per section G.1.2.3, fig. G.7 */
  
  r = 0;			/* r = run length of zeros */
  BR = 0;			/* BR = count of buffered bits added now */
  BR_buffer = entropy->bit_buffer + entropy->BE; /* Append bits to buffer */

  for (k = cinfo->Ss; k <= Se; k++) {
    if ((temp = absvalues[k]) == 0) {
      r++;
      continue;
    }

    /* Emit any required ZRLs, but not if they can be folded into EOB */
    while (r > 15 && k <= EOB) {
      /* emit any pending EOBRUN and the BE correction bits */
      emit_eobrun(entropy);
      /* Emit ZRL */
      emit_ac_symbol(entropy, entropy->ac_tbl_no, 0xF0);
      r -= 16;
      /* Emit buffered correction bits that must be associated with ZRL */
      emit_buffered_bits(entropy, BR_buffer, BR);
      BR_buffer = entropy->bit_buffer; /* BE bits are gone now */
      BR = 0;
    }

    /* If the coef was previously nonzero, it only needs a correction bit.
     * NOTE: a straight translation of the spec's figure G.7 would suggest
     * that we also need to test r > 15.  But if r > 15, we can only get here
     * if k > EOB, which implies that this coefficient is not 1.
     */
    if (temp > 1) {
      /* The correction bit is the next bit of the absolute value. */
      BR_buffer[BR++] = (char) (temp & 1);
      continue;
    }

    /* Emit any pending EOBRUN and the BE correction bits */
    emit_eobrun(entropy);

    /* Count/emit Huffman symbol for run length / number of bits */
    emit_ac_symbol(entropy, entropy->ac_tbl_no, (r << 4) + 1);

    /* Emit output bit for newly-nonzero coef */
    temp = ((*block)[natural_order[k]] < 0) ? 0 : 1;
    emit_bits_e(entropy, (unsigned int) temp, 1);

    /* Emit buffered correction bits that must be associated with this code */
    emit_buffered_bits(entropy, BR_buffer, BR);
    BR_buffer = entropy->bit_buffer; /* BE bits are gone now */
    BR = 0;
    r = 0;			/* reset zero run length */
  }

  if (r > 0 || BR > 0) {	/* If there are trailing zeroes, */
    entropy->EOBRUN++;		/* count an EOB */
    entropy->BE += BR;		/* concat my correction bits to older ones */
    /* We force out the EOB if we risk either:
     * 1. overflow of the EOB counter;
     * 2. overflow of the correction bit buffer during the next MCU.
     */
    if (entropy->EOBRUN == 0x7FFF || entropy->BE > (MAX_CORR_BITS-DCTSIZE2+1))
      emit_eobrun(entropy);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}